

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ushort local_e6;
  uint r;
  uint uStack_e0;
  unsigned_short mask;
  int pollrc;
  curl_socket_t s_1;
  curl_socket_t s;
  pollfd a_few_on_stack [10];
  long lStack_80;
  int retcode;
  long timeout_internal;
  pollfd *ppStack_70;
  _Bool ufds_malloc;
  pollfd *ufds;
  uint curlfds;
  uint nfds;
  uint i;
  int bitmap;
  curl_socket_t sockbunch [5];
  Curl_easy *local_38;
  Curl_easy *data;
  int *ret_local;
  int timeout_ms_local;
  uint extra_nfds_local;
  curl_waitfd *extra_fds_local;
  Curl_multi *multi_local;
  
  ufds._4_4_ = 0;
  ppStack_70 = (pollfd *)0x0;
  timeout_internal._7_1_ = 0;
  a_few_on_stack[9].events = 0;
  a_few_on_stack[9].revents = 0;
  if ((multi == (Curl_multi *)0x0) || (multi->type != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((multi->in_callback & 1U) == 0) {
    for (local_38 = multi->easyp; local_38 != (Curl_easy *)0x0; local_38 = local_38->next) {
      nfds = multi_getsock(local_38,(curl_socket_t *)&i,5);
      for (curlfds = 0; curlfds < 5; curlfds = curlfds + 1) {
        pollrc = -1;
        if ((nfds & 1 << ((byte)curlfds & 0x1f)) != 0) {
          ufds._4_4_ = ufds._4_4_ + 1;
          pollrc = (&i)[curlfds];
        }
        if ((nfds & 1 << ((byte)curlfds + 0x10 & 0x1f)) != 0) {
          ufds._4_4_ = ufds._4_4_ + 1;
          pollrc = (&i)[curlfds];
        }
        if (pollrc == -1) break;
      }
    }
    multi_timeout(multi,&stack0xffffffffffffff80);
    ret_local._0_4_ = timeout_ms;
    if ((-1 < lStack_80) && (lStack_80 < timeout_ms)) {
      ret_local._0_4_ = (int)lStack_80;
    }
    ufds._0_4_ = ufds._4_4_;
    ufds._4_4_ = extra_nfds + ufds._4_4_;
    if (ufds._4_4_ != 0) {
      if (ufds._4_4_ < 0xb) {
        ppStack_70 = (pollfd *)&s_1;
      }
      else {
        ppStack_70 = (pollfd *)(*Curl_cmalloc)((ulong)ufds._4_4_ << 3);
        if (ppStack_70 == (pollfd *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        timeout_internal._7_1_ = 1;
      }
    }
    ufds._4_4_ = 0;
    if ((int)ufds != 0) {
      for (local_38 = multi->easyp; local_38 != (Curl_easy *)0x0; local_38 = local_38->next) {
        uVar2 = multi_getsock(local_38,(curl_socket_t *)&i,5);
        nfds = uVar2;
        for (curlfds = 0; curlfds < 5; curlfds = curlfds + 1) {
          uStack_e0 = 0xffffffff;
          if ((uVar2 & 1 << ((byte)curlfds & 0x1f)) != 0) {
            ppStack_70[ufds._4_4_].fd = (&i)[curlfds];
            ppStack_70[ufds._4_4_].events = 1;
            ufds._4_4_ = ufds._4_4_ + 1;
            uStack_e0 = (&i)[curlfds];
          }
          if ((uVar2 & 1 << ((byte)curlfds + 0x10 & 0x1f)) != 0) {
            ppStack_70[ufds._4_4_].fd = (&i)[curlfds];
            ppStack_70[ufds._4_4_].events = 4;
            ufds._4_4_ = ufds._4_4_ + 1;
            uStack_e0 = (&i)[curlfds];
          }
          if (uStack_e0 == 0xffffffff) break;
        }
      }
    }
    for (curlfds = 0; curlfds < extra_nfds; curlfds = curlfds + 1) {
      ppStack_70[ufds._4_4_].fd = extra_fds[curlfds].fd;
      ppStack_70[ufds._4_4_].events = 0;
      if ((extra_fds[curlfds].events & 1U) != 0) {
        ppStack_70[ufds._4_4_].events = ppStack_70[ufds._4_4_].events | 1;
      }
      if ((extra_fds[curlfds].events & 2U) != 0) {
        ppStack_70[ufds._4_4_].events = ppStack_70[ufds._4_4_].events | 2;
      }
      if ((extra_fds[curlfds].events & 4U) != 0) {
        ppStack_70[ufds._4_4_].events = ppStack_70[ufds._4_4_].events | 4;
      }
      ufds._4_4_ = ufds._4_4_ + 1;
    }
    if ((ufds._4_4_ != 0) && (iVar3 = Curl_poll(ppStack_70,ufds._4_4_,(int)ret_local), 0 < iVar3)) {
      for (curlfds = 0; a_few_on_stack[9]._4_4_ = iVar3, curlfds < extra_nfds; curlfds = curlfds + 1
          ) {
        uVar1 = ppStack_70[(int)ufds + curlfds].revents;
        local_e6 = (ushort)((uVar1 & 1) != 0);
        if ((uVar1 & 4) != 0) {
          local_e6 = local_e6 | 4;
        }
        if ((uVar1 & 2) != 0) {
          local_e6 = local_e6 | 2;
        }
        extra_fds[curlfds].revents = local_e6;
      }
    }
    if ((timeout_internal._7_1_ & 1) != 0) {
      (*Curl_cfree)(ppStack_70);
    }
    if (ret != (int *)0x0) {
      *ret = a_few_on_stack[9]._4_4_;
    }
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  bool ufds_malloc = FALSE;
  long timeout_internal;
  int retcode = 0;
  struct pollfd a_few_on_stack[NUM_POLLS_ON_STACK];

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  /* Count up how many fds we have from the multi handle */
  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds) {
    if(nfds > NUM_POLLS_ON_STACK) {
      /* 'nfds' is a 32 bit value and 'struct pollfd' is typically 8 bytes
         big, so at 2^29 sockets this value might wrap. When a process gets
         the capability to actually handle over 500 million sockets this
         calculation needs a integer overflow check. */
      ufds = malloc(nfds * sizeof(struct pollfd));
      if(!ufds)
        return CURLM_OUT_OF_MEMORY;
      ufds_malloc = TRUE;
    }
    else
      ufds = &a_few_on_stack[0];
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data = multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  if(ufds_malloc)
    free(ufds);
  if(ret)
    *ret = retcode;
  return CURLM_OK;
}